

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall
script_stack_entry::script_stack_entry
          (script_stack_entry *this,script_stack_entry *encp,int old_more,CVmNetFile *netfile,
          osfildef *outfp,vm_val_t *filespec,int new_more,int is_quiet,int is_event_script)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_globalvar_t *pvVar3;
  
  this->enc = encp;
  this->old_more_mode = old_more;
  this->netfile = netfile;
  this->fp = outfp;
  this->more_mode = new_more;
  this->quiet = is_quiet;
  this->event_script = is_event_script;
  this->filespec = (vm_globalvar_t *)0x0;
  if (filespec != (vm_val_t *)0x0) {
    pvVar3 = CVmObjTable::create_global_var(&G_obj_table_X);
    this->filespec = pvVar3;
    uVar2 = *(undefined4 *)&filespec->field_0x4;
    aVar1 = filespec->val;
    (pvVar3->val).typ = filespec->typ;
    *(undefined4 *)&(pvVar3->val).field_0x4 = uVar2;
    (pvVar3->val).val = aVar1;
  }
  return;
}

Assistant:

script_stack_entry::script_stack_entry(
    VMG_ script_stack_entry *encp, int old_more,
    class CVmNetFile *netfile, osfildef *outfp, const vm_val_t *filespec,
    int new_more, int is_quiet, int is_event_script)
{
    /* remember the stack level settings */
    this->enc = encp;
    this->old_more_mode = old_more;
    this->netfile = netfile;
    this->fp = outfp;
    this->more_mode = new_more;
    this->quiet = is_quiet;
    this->event_script = is_event_script;

    /* if we have a file spec, create a global for it for gc protection */
    this->filespec = 0;
    if (filespec != 0)
    {
        this->filespec = G_obj_table->create_global_var();
        this->filespec->val = *filespec;
    }
}